

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O3

void dukglue_read<std::vector<int,std::allocator<int>>>
               (duk_context *ctx,duk_idx_t arg_idx,vector<int,_std::allocator<int>_> *out)

{
  pointer piVar1;
  pointer piVar2;
  duk_idx_t in_ECX;
  vector<int,_std::allocator<int>_> local_28;
  
  dukglue::types::DukType<std::vector<int,std::allocator<int>>>::
  read<std::vector<int,std::allocator<int>>>
            (&local_28,(DukType<std::vector<int,std::allocator<int>>> *)ctx,
             (duk_context *)(ulong)(uint)arg_idx,in_ECX);
  piVar1 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)piVar2 - (long)piVar1);
    if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void dukglue_read(duk_context* ctx, duk_idx_t arg_idx, RetT* out)
{
	// ArgStorage has some static_asserts in it that validate value types,
	// so we typedef it to force ArgStorage<RetType> to compile and run the asserts
	typedef typename dukglue::types::ArgStorage<RetT>::type ValidateReturnType;

	using namespace dukglue::types;
	*out = DukType<typename Bare<RetT>::type>::template read<RetT>(ctx, arg_idx);
}